

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  int *piVar1;
  anon_struct_16_2_267fbce2 *paVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t *p;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  anon_struct_16_2_267fbce2 *paVar11;
  wchar_t *pwVar12;
  uint uVar13;
  uint uVar14;
  wchar_t wVar15;
  ulong uVar16;
  wchar_t *pwVar17;
  ulong uVar18;
  ulong uVar19;
  wchar_t *pwVar20;
  ulong uVar21;
  size_t sStackY_f0;
  wchar_t local_d8;
  wchar_t local_d4;
  wchar_t id;
  wchar_t local_cc;
  wchar_t *local_c8;
  wchar_t local_c0;
  wchar_t local_bc;
  wchar_t *local_b8;
  wchar_t *local_b0;
  wchar_t local_a4;
  archive_acl *local_a0;
  anon_struct_16_2_267fbce2 field [6];
  
  uVar21 = 5;
  local_c0 = want_type;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type == L'㰀') {
      uVar21 = 6;
    }
    else {
      if (want_type != L'̀') {
        return L'\xffffffe2';
      }
      local_c0 = L'Ā';
    }
  }
  local_a4 = L'\0';
  local_a0 = acl;
  wVar7 = L'\0';
switchD_0027a589_caseD_7:
  do {
    do {
      local_bc = wVar7;
      if ((text == (wchar_t *)0x0) || (*text == L'\0')) {
        archive_acl_reset(local_a0,local_a4);
        return local_bc;
      }
      uVar16 = 0;
      uVar19 = 1;
      paVar2 = field + 1;
      do {
        while ((paVar11 = paVar2, uVar8 = uVar19, uVar18 = uVar16, uVar16 = (ulong)(uint)*text,
               uVar16 < 0x21 && ((0x100000600U >> (uVar16 & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar16 = uVar18;
          uVar19 = uVar8;
          paVar2 = paVar11;
        }
        uVar19 = 0;
        while ((uVar4 = (uint)uVar16, 0x3a < uVar4 ||
               ((0x400100800000401U >> (uVar16 & 0x3f) & 1) == 0))) {
          lVar9 = uVar19 + 4;
          uVar19 = uVar19 + 4;
          uVar16 = (ulong)*(uint *)((long)text + lVar9);
        }
        pwVar12 = (wchar_t *)((long)text + uVar19);
        pwVar17 = text;
        for (pwVar20 = pwVar12;
            (uVar19 != 0 && (pwVar17 = pwVar20, (ulong)(uint)pwVar20[-1] < 0x21));
            pwVar20 = pwVar20 + -1) {
          uVar19 = 0x100000600U >> ((ulong)(uint)pwVar20[-1] & 0x3f) & 1;
        }
        uVar16 = 0x23;
        if (uVar4 == 0x23) {
          while ((uVar4 = (uint)uVar16, 0x2c < uVar4 ||
                 ((0x100000000401U >> (uVar16 & 0x3f) & 1) == 0))) {
            pwVar20 = pwVar12 + 1;
            pwVar12 = pwVar12 + 1;
            uVar16 = (ulong)(uint)*pwVar20;
          }
        }
        if (uVar18 < uVar21) {
          field[uVar18].start = text;
          field[uVar18].end = pwVar17;
        }
        pwVar20 = field[0].start;
        text = pwVar12 + (uVar4 != 0);
        uVar16 = uVar18 + 1;
        uVar19 = uVar8 + 1;
        paVar2 = paVar11 + 1;
      } while (uVar4 == 0x3a);
      for (; uVar8 < uVar21; uVar8 = uVar8 + 1) {
        paVar11->start = (wchar_t *)0x0;
        paVar11->end = (wchar_t *)0x0;
        paVar11 = paVar11 + 1;
      }
    } while ((field[0].start != (wchar_t *)0x0) && (wVar7 = local_bc, *field[0].start == L'#'));
    id = L'\xffffffff';
    local_cc = L'\0';
    uVar16 = (long)field[0].end - (long)field[0].start;
    if (local_c0 == L'㰀') goto code_r0x0027a561;
    uVar19 = 0;
    if (*field[0].start == L'd') {
      local_d4 = L'Ȁ';
      if (uVar16 == 4) {
LAB_0027a5ce:
        uVar19 = 1;
      }
      else {
        if (uVar16 < 0x19) goto LAB_0027a607;
        local_c8 = field[0].start;
        iVar3 = wmemcmp(field[0].start + 1,anon_var_dwarf_1de4d6,6);
        if (iVar3 == 0) {
          uVar19 = 0;
          if (uVar16 == 0x1c) goto LAB_0027a5ce;
          field[0].start = local_c8 + 7;
        }
        else {
          local_d4 = local_c0;
          uVar19 = 0;
        }
      }
    }
    else {
LAB_0027a607:
      local_d4 = local_c0;
    }
    uVar4 = (int)uVar19 + 1;
    uVar16 = (ulong)(uVar4 * 0x10);
    local_b8 = *(wchar_t **)((long)&field[0].start + uVar16);
    local_b0 = *(wchar_t **)((long)&field[0].end + uVar16);
    local_c8 = (wchar_t *)uVar19;
    isint_w(local_b8,local_b0,&id);
    iVar3 = (int)local_c8;
    uVar14 = (uint)uVar18;
    if ((id == L'\xffffffff') && (iVar3 + 3U <= uVar14)) {
      uVar16 = (ulong)((iVar3 + 3U) * 0x10);
      isint_w(*(wchar_t **)((long)&field[0].start + uVar16),
              *(wchar_t **)((long)&field[0].end + uVar16),&id);
      iVar3 = (int)local_c8;
    }
    piVar10 = *(int **)((long)&field[0].start + (ulong)(uint)(iVar3 << 4));
    uVar13 = *piVar10 - 0x67U >> 1 | (uint)((*piVar10 - 0x67U & 1) != 0) << 0x1f;
    wVar7 = L'\xffffffec';
  } while (7 < uVar13);
  lVar9 = *(long *)((long)&field[0].end + (ulong)(uint)(iVar3 << 4)) - (long)piVar10;
  wVar7 = L'\xffffffec';
  switch(uVar13) {
  case 0:
    wVar15 = L'✔';
    local_d8 = L'✓';
    if (lVar9 != 4) {
      wVar7 = L'\xffffffec';
      if (lVar9 != 0x14) goto switchD_0027a589_caseD_7;
      piVar1 = anon_var_dwarf_3b85b;
      sStackY_f0 = 4;
      wVar15 = L'✔';
LAB_0027a7bb:
      iVar5 = wmemcmp(piVar10 + 1,piVar1 + 2,sStackY_f0);
      iVar3 = (int)local_c8;
      wVar7 = L'\xffffffec';
      if (iVar5 != 0) goto switchD_0027a589_caseD_7;
    }
    break;
  default:
    goto switchD_0027a589_caseD_7;
  case 3:
    local_d8 = L'✕';
    if (lVar9 == 4) goto LAB_0027a897;
    wVar7 = L'\xffffffec';
    if (lVar9 != 0x10) goto switchD_0027a589_caseD_7;
    piVar1 = anon_var_dwarf_1de676;
    sStackY_f0 = 3;
LAB_0027a87a:
    iVar5 = wmemcmp(piVar10 + 1,piVar1 + 1,sStackY_f0);
    iVar3 = (int)local_c8;
    wVar7 = L'\xffffffec';
    if (iVar5 != 0) goto switchD_0027a589_caseD_7;
    goto LAB_0027a897;
  case 4:
    local_d8 = L'✖';
    if (lVar9 != 4) {
      wVar7 = L'\xffffffec';
      if (lVar9 == 0x14) {
        piVar1 = anon_var_dwarf_1de681;
        sStackY_f0 = 4;
        goto LAB_0027a87a;
      }
      goto switchD_0027a589_caseD_7;
    }
LAB_0027a897:
    pwVar12 = local_b8;
    if (local_b0 <= local_b8 || uVar4 != uVar14) {
LAB_0027a8dc:
      wVar7 = L'\xffffffec';
      if (iVar3 + 2U != uVar14 || local_b0 <= pwVar12) {
        pwVar12 = (wchar_t *)0x0;
        pwVar20 = (wchar_t *)0x0;
        iVar5 = 0;
        goto LAB_0027a8fd;
      }
      goto switchD_0027a589_caseD_7;
    }
    wVar7 = ismode_w(local_b8,local_b0,&local_cc);
    iVar3 = (int)local_c8;
    if (wVar7 == L'\0') goto LAB_0027a8dc;
    pwVar12 = (wchar_t *)0x0;
    pwVar20 = (wchar_t *)0x0;
    iVar5 = -1;
    goto LAB_0027a8fd;
  case 7:
    wVar15 = L'✒';
    local_d8 = L'✑';
    if (lVar9 != 4) {
      wVar7 = L'\xffffffec';
      if (lVar9 == 0x10) {
        piVar1 = anon_var_dwarf_3bd5d;
        sStackY_f0 = 3;
        wVar15 = L'✒';
        goto LAB_0027a7bb;
      }
      goto switchD_0027a589_caseD_7;
    }
  }
  iVar5 = 0;
  pwVar12 = local_b0;
  pwVar20 = local_b8;
  if ((local_b0 <= local_b8) && (id == L'\xffffffff')) {
    pwVar12 = (wchar_t *)0x0;
    pwVar20 = (wchar_t *)0x0;
    local_d8 = wVar15;
  }
LAB_0027a8fd:
  wVar15 = local_cc;
  if (local_cc == L'\0') {
    uVar4 = iVar5 + iVar3 + 2;
    local_b0 = pwVar12;
    wVar6 = ismode_w(field[uVar4].start,field[uVar4].end,&local_cc);
    pwVar12 = local_b0;
    wVar15 = local_cc;
    wVar7 = L'\xffffffec';
    if (wVar6 != L'\0') goto LAB_0027abd2;
    goto switchD_0027a589_caseD_7;
  }
LAB_0027abd2:
  wVar7 = archive_acl_add_entry_w_len
                    (local_a0,local_d4,wVar15,local_d8,id,pwVar20,(long)pwVar12 - (long)pwVar20 >> 2
                    );
  if (wVar7 < L'\xffffffec') {
    return wVar7;
  }
  if (wVar7 != L'\0') {
    local_bc = L'\xffffffec';
  }
  local_a4 = local_a4 | local_d4;
  wVar7 = local_bc;
  goto switchD_0027a589_caseD_7;
code_r0x0027a561:
  wVar7 = L'\xffffffec';
  switch((long)uVar16 >> 2) {
  case 4:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_3bd5d + 1,4);
    wVar7 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_0027a589_caseD_7;
    local_d8 = L'✑';
    goto LAB_0027a82f;
  case 5:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_3b85b + 1,5);
    wVar7 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_0027a589_caseD_7;
    local_d8 = L'✓';
LAB_0027a82f:
    pwVar12 = field[1].end;
    local_b8 = field[1].start;
    isint_w(field[1].start,field[1].end,&id);
    iVar3 = 1;
    break;
  case 6:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_1de553,6);
    if (iVar3 != 0) {
      iVar3 = wmemcmp(pwVar20,anon_var_dwarf_1de55e,6);
      wVar7 = L'\xffffffec';
      if (iVar3 != 0) goto switchD_0027a589_caseD_7;
      local_d8 = L'✔';
      goto LAB_0027a781;
    }
    pwVar12 = (wchar_t *)0x0;
    local_d8 = L'✒';
    local_b8 = (wchar_t *)0x0;
    iVar3 = 0;
    break;
  default:
    goto switchD_0027a589_caseD_7;
  case 9:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_1de569,9);
    wVar7 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_0027a589_caseD_7;
    local_d8 = L'❻';
LAB_0027a781:
    pwVar12 = (wchar_t *)0x0;
    local_b8 = (wchar_t *)0x0;
    iVar3 = 0;
  }
  pwVar20 = (wchar_t *)(ulong)(uint)(iVar3 << 4);
  piVar10 = *(int **)((long)&field[1].start + (long)pwVar20);
  wVar15 = L'\0';
LAB_0027a991:
  if (*(int **)((long)&field[1].end + (long)pwVar20) <= piVar10) goto LAB_0027aa39;
  iVar3 = *piVar10;
  piVar10 = piVar10 + 1;
  uVar4 = 8;
  switch(iVar3) {
  case 0x6f:
    uVar4 = 0x4000;
    break;
  case 0x70:
    uVar4 = 0x20;
    break;
  case 0x71:
  case 0x74:
  case 0x75:
  case 0x76:
    goto switchD_0027a9e9_caseD_71;
  case 0x72:
    break;
  case 0x73:
    uVar4 = 0x8000;
    break;
  case 0x77:
    uVar4 = 0x10;
    break;
  case 0x78:
    uVar4 = 1;
    break;
  default:
    goto switchD_0027a9e9_default;
  }
switchD_0027a9e9_caseD_72:
  wVar15 = wVar15 | uVar4;
  goto LAB_0027a991;
LAB_0027aa39:
  piVar10 = *(int **)((long)&field[2].start + (long)pwVar20);
  while (local_b0 = pwVar12, piVar10 < *(int **)((long)&field[2].end + (long)pwVar20)) {
    iVar3 = *piVar10;
    piVar10 = piVar10 + 1;
    if (iVar3 != 0x2d) {
      if (iVar3 == 0x46) {
        uVar4 = 0x40000000;
      }
      else if (iVar3 == 0x49) {
        uVar4 = 0x1000000;
      }
      else if (iVar3 == 0x53) {
        uVar4 = 0x20000000;
      }
      else if (iVar3 == 0x6e) {
        uVar4 = 0x8000000;
      }
      else if (iVar3 == 0x66) {
        uVar4 = 0x2000000;
      }
      else if (iVar3 == 0x69) {
        uVar4 = 0x10000000;
      }
      else {
        if (iVar3 != 100) goto switchD_0027a9e9_caseD_71;
        uVar4 = 0x4000000;
      }
      wVar15 = wVar15 | uVar4;
    }
  }
  pwVar12 = *(wchar_t **)((long)&field[3].start + (long)pwVar20);
  lVar9 = *(long *)((long)&field[3].end + (long)pwVar20) - (long)pwVar12;
  local_cc = wVar15;
  if (lVar9 == 0x14) {
    local_c8 = pwVar20;
    iVar3 = wmemcmp(pwVar12,anon_var_dwarf_1de58b,5);
    if (iVar3 == 0) {
      local_d4 = L'Ѐ';
      pwVar20 = local_c8;
    }
    else {
      iVar3 = wmemcmp(pwVar12,anon_var_dwarf_1de596,5);
      if (iVar3 == 0) {
        local_d4 = L'က';
        pwVar20 = local_c8;
      }
      else {
        iVar3 = wmemcmp(pwVar12,anon_var_dwarf_1de5a1,5);
        wVar7 = L'\xffffffec';
        if (iVar3 != 0) goto switchD_0027a589_caseD_7;
        local_d4 = L'\x2000';
        pwVar20 = local_c8;
      }
    }
  }
  else {
    wVar7 = L'\xffffffec';
    if (lVar9 != 0x10) goto switchD_0027a589_caseD_7;
    iVar3 = wmemcmp(pwVar12,anon_var_dwarf_1de580,4);
    wVar7 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_0027a589_caseD_7;
    local_d4 = L'ࠀ';
  }
  isint_w(*(wchar_t **)((long)&field[4].start + (long)pwVar20),
          *(wchar_t **)((long)&field[4].end + (long)pwVar20),&id);
  pwVar12 = local_b0;
  pwVar20 = local_b8;
  goto LAB_0027abd2;
switchD_0027a9e9_default:
  if (iVar3 == 0x2d) goto LAB_0027a991;
  if (iVar3 == 0x41) {
    uVar4 = 0x400;
  }
  else if (iVar3 == 0x43) {
    uVar4 = 0x2000;
  }
  else if (iVar3 == 0x44) {
    uVar4 = 0x100;
  }
  else if (iVar3 == 0x52) {
    uVar4 = 0x40;
  }
  else if (iVar3 == 0x57) {
    uVar4 = 0x80;
  }
  else if (iVar3 == 0x61) {
    uVar4 = 0x200;
  }
  else if (iVar3 == 99) {
    uVar4 = 0x1000;
  }
  else {
    if (iVar3 != 100) goto switchD_0027a9e9_caseD_71;
    uVar4 = 0x800;
  }
  goto switchD_0027a9e9_caseD_72;
switchD_0027a9e9_caseD_71:
  local_cc = wVar15;
  wVar7 = L'\xffffffec';
  goto switchD_0027a589_caseD_7;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}